

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbify.cc
# Opt level: O3

float loss_cs(cbify *data,v_array<COST_SENSITIVE::wclass> *costs,uint32_t final_prediction)

{
  wclass *pwVar1;
  float fVar2;
  
  pwVar1 = costs->_begin;
  fVar2 = 0.0;
  do {
    if (pwVar1 == costs->_end) {
LAB_001c403f:
      return (data->loss1 - data->loss0) * fVar2 + data->loss0;
    }
    if (pwVar1->class_index == final_prediction) {
      fVar2 = pwVar1->x;
      goto LAB_001c403f;
    }
    pwVar1 = pwVar1 + 1;
  } while( true );
}

Assistant:

float loss_cs(cbify& data, v_array<COST_SENSITIVE::wclass>& costs, uint32_t final_prediction)
{
  float cost = 0.;
  for (auto wc : costs)
  {
    if (wc.class_index == final_prediction)
    {
      cost = wc.x;
      break;
    }
  }
  return data.loss0 + (data.loss1 - data.loss0) * cost;
}